

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O2

void wabt::RenameToIdentifiers<wabt::Func>
               (vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *things,BindingHash *bh,
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *filter)

{
  pointer ppFVar1;
  Index i;
  pointer ppFVar2;
  
  ppFVar1 = (things->super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  i = 0;
  for (ppFVar2 = (things->super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppFVar2 != ppFVar1; ppFVar2 = ppFVar2 + 1) {
    RenameToIdentifier(&(*ppFVar2)->name,i,bh,filter);
    i = i + 1;
  }
  return;
}

Assistant:

void RenameToIdentifiers(std::vector<T*>& things,
                         BindingHash& bh,
                         const std::set<std::string_view>* filter) {
  Index i = 0;
  for (auto thing : things) {
    RenameToIdentifier(thing->name, i++, bh, filter);
  }
}